

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O3

_Bool cat(char **dest,char *str,size_t n)

{
  size_t sVar1;
  char *pcVar2;
  
  if ((dest != (char **)0x0) && (pcVar2 = *dest, pcVar2 != (char *)0x0)) {
    sVar1 = strlen(pcVar2);
    pcVar2 = (char *)resize(pcVar2,sVar1 + n + 1);
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar2 + sVar1,str,n);
      pcVar2[sVar1 + n] = '\0';
      *dest = pcVar2;
    }
    return pcVar2 != (char *)0x0;
  }
  __assert_fail("dest != NULL && *dest != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                ,0x198,"_Bool cat(char **, const char *, size_t)");
}

Assistant:

static bool
cat(char **dest, const char *str, size_t n)
{
   char *both;
   size_t existing_length;
   assert(dest != NULL && *dest != NULL);

   existing_length = strlen(*dest);
   both = resize(*dest, existing_length + n + 1);
   if (unlikely(both == NULL))
      return false;

   memcpy(both + existing_length, str, n);
   both[existing_length + n] = '\0';

   *dest = both;
   return true;
}